

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp_etc.c
# Opt level: O1

void ppMinPoly(word *b,word *a,size_t l,void *stack)

{
  word *a_00;
  word *a_01;
  ulong uVar1;
  word *a_02;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  word wVar5;
  word *b_00;
  ulong n;
  ulong n_00;
  
  uVar1 = l + 0x3f >> 6;
  n = l + 0x40 >> 6;
  sVar2 = uVar1 * 2;
  a_00 = (word *)((long)stack + uVar1 * 0x10);
  a_02 = a_00 + uVar1 * 5 + 3;
  a_01 = a_02 + n;
  wwCopy((word *)stack,a,sVar2);
  wwTrimHi((word *)stack,sVar2,l * 2);
  sVar2 = wwWordSize((word *)stack,sVar2);
  n_00 = l * 2 + 0x40 >> 6;
  wwSetZero(a_00,n_00);
  wwSetBit(a_00,l * 2,1);
  wwSetW(a_02,n,1);
  wwSetZero(a_01,n);
  sVar3 = wwBitSize((word *)stack,sVar2);
  if (l < sVar3) {
    do {
      ppDiv(a_00 + uVar1 * 2 + 1,a_00 + uVar1 * 3 + 3,a_00,n_00,(word *)stack,sVar2,
            a_01 + n + uVar1 + 2);
      sVar3 = wwWordSize(a_00 + uVar1 * 2 + 1,(n_00 - sVar2) + 1);
      sVar4 = wwWordSize(a_02,n);
      if (sVar3 != 0) {
        b_00 = (word *)((long)stack + sVar3 * 8 + uVar1 * 0x38 + n * 8 + 0x10);
        do {
          wVar5 = ppAddMulW(b_00,a_02,sVar4,a_00[uVar1 * 2 + sVar3],a_01 + n + uVar1 + 2);
          b_00[sVar4] = b_00[sVar4] ^ wVar5;
          b_00 = b_00 + -1;
          sVar3 = sVar3 - 1;
        } while (sVar3 != 0);
      }
      wwSwap(a_02,a_01,n);
      wwCopy(a_00,(word *)stack,sVar2);
      wwCopy((word *)stack,a_00 + uVar1 * 3 + 3,sVar2);
      sVar3 = wwWordSize((word *)stack,sVar2);
      sVar4 = wwBitSize((word *)stack,sVar3);
      n_00 = sVar2;
      sVar2 = sVar3;
    } while (l < sVar4);
  }
  wwCopy(b,a_02,n);
  return;
}

Assistant:

void ppMinPoly(word b[], const word a[], size_t l, void* stack)
{
	const size_t n = W_OF_B(l);
	const size_t m = W_OF_B(l + 1);
	size_t na, nb;
	// переменные в stack
	word* aa = (word*)stack;
	word* bb = aa + 2 * n;
	word* q = bb + 2 * n + 1;
	word* r = q + n + 2;
	word* da = r + 2 * n;
	word* db = da + m;
	stack = db + m + n + 2;
	// pre
	ASSERT(wwIsValid(b, m) && wwIsValid(a, 2 * n));
	// aa <- a
	wwCopy(aa, a, 2 * n);
	wwTrimHi(aa, 2 * n, 2 * l);
	na = wwWordSize(aa, 2 * n);
	// bb <- x^{2l}
	nb = W_OF_B(2 * l + 1);
	wwSetZero(bb, nb);
	wwSetBit(bb, 2 * l, 1);
	// da <- 1
	wwSetW(da, m, 1);
	// db <- 0
	wwSetZero(db, m);
	// пока deg(aa) >= len
	while (ppDeg(aa, na) + 1 > l)
	{
		size_t nq, nda;
		// (q, r) <- (bb div aa, bb mod aa)
		ppDiv(q, r, bb, nb, aa, na, stack);
		// db <- db + q * da
		nq = wwWordSize(q, nb - na + 1);
		nda = wwWordSize(da, m);
		while (nq--)
			db[nq + nda] ^= ppAddMulW(db + nq, da, nda, q[nq], stack);
		ASSERT(nq + nda <= m || wwIsZero(db, nq + nda - m));
		// da <-> db
		wwSwap(da, db, m);
		// bb <- aa
		wwCopy(bb, aa, na);
		nb = na;
		// aa <- r
		wwCopy(aa, r, na);
		na = wwWordSize(aa, na);
	}
	// b <- da
	wwCopy(b, da, m);
}